

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa_sign.c
# Opt level: O0

int main(int argc,char **argv)

{
  FILE *pFVar1;
  size_t sVar2;
  mbedtls_md_info_t *md_info;
  char *pcVar3;
  char local_7a8 [8];
  char filename [512];
  uchar buf [1024];
  uchar hash [32];
  undefined1 local_180 [8];
  mbedtls_rsa_context rsa;
  size_t i;
  int ret;
  FILE *f;
  char **argv_local;
  int argc_local;
  
  mbedtls_rsa_init((mbedtls_rsa_context *)local_180,0,0);
  i._4_4_ = 1;
  if (argc == 2) {
    printf("\n  . Reading private key from rsa_priv.txt");
    fflush(_stdout);
    pFVar1 = fopen("rsa_priv.txt","rb");
    if (pFVar1 == (FILE *)0x0) {
      i._4_4_ = 1;
      printf(" failed\n  ! Could not open rsa_priv.txt\n  ! Please run rsa_genkey first\n\n");
    }
    else {
      i._4_4_ = mbedtls_mpi_read_file((mbedtls_mpi *)&rsa.len,0x10,(FILE *)pFVar1);
      if (i._4_4_ == 0) {
        i._4_4_ = mbedtls_mpi_read_file((mbedtls_mpi *)&rsa.N.p,0x10,(FILE *)pFVar1);
        if (i._4_4_ == 0) {
          i._4_4_ = mbedtls_mpi_read_file((mbedtls_mpi *)&rsa.E.p,0x10,(FILE *)pFVar1);
          if (i._4_4_ == 0) {
            i._4_4_ = mbedtls_mpi_read_file((mbedtls_mpi *)&rsa.D.p,0x10,(FILE *)pFVar1);
            if (i._4_4_ == 0) {
              i._4_4_ = mbedtls_mpi_read_file((mbedtls_mpi *)&rsa.P.p,0x10,(FILE *)pFVar1);
              if (i._4_4_ == 0) {
                i._4_4_ = mbedtls_mpi_read_file((mbedtls_mpi *)&rsa.Q.p,0x10,(FILE *)pFVar1);
                if (i._4_4_ == 0) {
                  i._4_4_ = mbedtls_mpi_read_file((mbedtls_mpi *)&rsa.DP.p,0x10,(FILE *)pFVar1);
                  if (i._4_4_ == 0) {
                    i._4_4_ = mbedtls_mpi_read_file((mbedtls_mpi *)&rsa.DQ.p,0x10,(FILE *)pFVar1);
                    if (i._4_4_ == 0) {
                      sVar2 = mbedtls_mpi_bitlen((mbedtls_mpi *)&rsa.len);
                      rsa._0_8_ = sVar2 + 7 >> 3;
                      fclose(pFVar1);
                      printf("\n  . Checking the private key");
                      fflush(_stdout);
                      i._4_4_ = mbedtls_rsa_check_privkey((mbedtls_rsa_context *)local_180);
                      if (i._4_4_ == 0) {
                        printf("\n  . Generating the RSA/SHA-256 signature");
                        fflush(_stdout);
                        md_info = mbedtls_md_info_from_type(MBEDTLS_MD_SHA256);
                        i._4_4_ = mbedtls_md_file(md_info,argv[1],buf + 0x3f8);
                        if (i._4_4_ == 0) {
                          i._4_4_ = mbedtls_rsa_pkcs1_sign
                                              ((mbedtls_rsa_context *)local_180,
                                               (_func_int_void_ptr_uchar_ptr_size_t *)0x0,
                                               (void *)0x0,1,MBEDTLS_MD_SHA256,0x14,buf + 0x3f8,
                                               (uchar *)(filename + 0x1f8));
                          if (i._4_4_ == 0) {
                            snprintf(local_7a8,0x200,"%s.sig",argv[1]);
                            pFVar1 = fopen(local_7a8,"wb+");
                            if (pFVar1 == (FILE *)0x0) {
                              i._4_4_ = 1;
                              printf(" failed\n  ! Could not create %s\n\n",argv[1]);
                            }
                            else {
                              rsa.padding = 0;
                              rsa.hash_id = 0;
                              for (; (ulong)rsa._328_8_ < (ulong)rsa._0_8_;
                                  rsa._328_8_ = rsa._328_8_ + 1) {
                                pcVar3 = " ";
                                if ((rsa._328_8_ + 1 & 0xf) == 0) {
                                  pcVar3 = "\r\n";
                                }
                                fprintf(pFVar1,"%02X%s",(ulong)(byte)filename[rsa._328_8_ + 0x1f8],
                                        pcVar3);
                              }
                              fclose(pFVar1);
                              printf("\n  . Done (created \"%s\")\n\n",local_7a8);
                            }
                          }
                          else {
                            printf(" failed\n  ! mbedtls_rsa_pkcs1_sign returned -0x%0x\n\n",
                                   (ulong)-i._4_4_);
                          }
                        }
                        else {
                          printf(" failed\n  ! Could not open or read %s\n\n",argv[1]);
                        }
                      }
                      else {
                        printf(" failed\n  ! mbedtls_rsa_check_privkey failed with -0x%0x\n",
                               (ulong)-i._4_4_);
                      }
                      goto LAB_0010563c;
                    }
                  }
                }
              }
            }
          }
        }
      }
      printf(" failed\n  ! mbedtls_mpi_read_file returned %d\n\n",(ulong)i._4_4_);
      fclose(pFVar1);
    }
  }
  else {
    printf("usage: rsa_sign <filename>\n");
  }
LAB_0010563c:
  mbedtls_rsa_free((mbedtls_rsa_context *)local_180);
  return i._4_4_;
}

Assistant:

int main( int argc, char *argv[] )
{
    FILE *f;
    int ret;
    size_t i;
    mbedtls_rsa_context rsa;
    unsigned char hash[32];
    unsigned char buf[MBEDTLS_MPI_MAX_SIZE];
    char filename[512];

    mbedtls_rsa_init( &rsa, MBEDTLS_RSA_PKCS_V15, 0 );
    ret = 1;

    if( argc != 2 )
    {
        mbedtls_printf( "usage: rsa_sign <filename>\n" );

#if defined(_WIN32)
        mbedtls_printf( "\n" );
#endif

        goto exit;
    }

    mbedtls_printf( "\n  . Reading private key from rsa_priv.txt" );
    fflush( stdout );

    if( ( f = fopen( "rsa_priv.txt", "rb" ) ) == NULL )
    {
        ret = 1;
        mbedtls_printf( " failed\n  ! Could not open rsa_priv.txt\n" \
                "  ! Please run rsa_genkey first\n\n" );
        goto exit;
    }

    if( ( ret = mbedtls_mpi_read_file( &rsa.N , 16, f ) ) != 0 ||
        ( ret = mbedtls_mpi_read_file( &rsa.E , 16, f ) ) != 0 ||
        ( ret = mbedtls_mpi_read_file( &rsa.D , 16, f ) ) != 0 ||
        ( ret = mbedtls_mpi_read_file( &rsa.P , 16, f ) ) != 0 ||
        ( ret = mbedtls_mpi_read_file( &rsa.Q , 16, f ) ) != 0 ||
        ( ret = mbedtls_mpi_read_file( &rsa.DP, 16, f ) ) != 0 ||
        ( ret = mbedtls_mpi_read_file( &rsa.DQ, 16, f ) ) != 0 ||
        ( ret = mbedtls_mpi_read_file( &rsa.QP, 16, f ) ) != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_mpi_read_file returned %d\n\n", ret );
        fclose( f );
        goto exit;
    }

    rsa.len = ( mbedtls_mpi_bitlen( &rsa.N ) + 7 ) >> 3;

    fclose( f );

    mbedtls_printf( "\n  . Checking the private key" );
    fflush( stdout );
    if( ( ret = mbedtls_rsa_check_privkey( &rsa ) ) != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_rsa_check_privkey failed with -0x%0x\n", -ret );
        goto exit;
    }

    /*
     * Compute the SHA-256 hash of the input file,
     * then calculate the RSA signature of the hash.
     */
    mbedtls_printf( "\n  . Generating the RSA/SHA-256 signature" );
    fflush( stdout );

    if( ( ret = mbedtls_md_file(
                    mbedtls_md_info_from_type( MBEDTLS_MD_SHA256 ),
                    argv[1], hash ) ) != 0 )
    {
        mbedtls_printf( " failed\n  ! Could not open or read %s\n\n", argv[1] );
        goto exit;
    }

    if( ( ret = mbedtls_rsa_pkcs1_sign( &rsa, NULL, NULL, MBEDTLS_RSA_PRIVATE, MBEDTLS_MD_SHA256,
                                20, hash, buf ) ) != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_rsa_pkcs1_sign returned -0x%0x\n\n", -ret );
        goto exit;
    }

    /*
     * Write the signature into <filename>.sig
     */
    mbedtls_snprintf( filename, sizeof(filename), "%s.sig", argv[1] );

    if( ( f = fopen( filename, "wb+" ) ) == NULL )
    {
        ret = 1;
        mbedtls_printf( " failed\n  ! Could not create %s\n\n", argv[1] );
        goto exit;
    }

    for( i = 0; i < rsa.len; i++ )
        mbedtls_fprintf( f, "%02X%s", buf[i],
                 ( i + 1 ) % 16 == 0 ? "\r\n" : " " );

    fclose( f );

    mbedtls_printf( "\n  . Done (created \"%s\")\n\n", filename );

exit:

    mbedtls_rsa_free( &rsa );

#if defined(_WIN32)
    mbedtls_printf( "  + Press Enter to exit this program.\n" );
    fflush( stdout ); getchar();
#endif

    return( ret );
}